

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-title.c
# Opt level: O1

void set_title(char *title)

{
  uv_loop_t **buffer_00;
  int iVar1;
  uv_loop_t *puVar2;
  uv_loop_t *loop;
  int extraout_EDX;
  void **ppvVar3;
  uv_handle_t *puVar4;
  int64_t eval_b;
  int64_t eval_a;
  char buffer [512];
  uv_handle_t auStack_a58 [4];
  uv_loop_t *puStack_950;
  undefined8 uStack_940;
  code *pcStack_938;
  void *pvStack_930;
  undefined1 auStack_928 [16];
  uv_process_t uStack_918;
  uv_loop_t *puStack_8b0;
  char *pcStack_8a8;
  long *plStack_8a0;
  long *plStack_898;
  undefined8 uStack_890;
  uv_process_options_t uStack_880;
  long alStack_830 [63];
  undefined1 uStack_631;
  uv_loop_t uStack_630;
  char *pcStack_230;
  char local_208 [512];
  
  iVar1 = uv_get_process_title(local_208,0x200);
  if (iVar1 == 0) {
    iVar1 = uv_set_process_title(title);
    if (iVar1 != 0) goto LAB_001b39b5;
    iVar1 = uv_get_process_title(local_208,0x200);
    if (iVar1 != 0) goto LAB_001b39c2;
    iVar1 = strcmp(local_208,title);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    set_title_cold_1();
LAB_001b39b5:
    set_title_cold_2();
LAB_001b39c2:
    set_title_cold_3();
  }
  set_title_cold_4();
  ppvVar3 = &pvStack_930;
  auStack_928._8_8_ = (uv_loop_t *)0x3ff;
  loop = &uStack_630;
  pcStack_938 = (code *)0x1b3a04;
  pcStack_230 = title;
  iVar1 = uv_exepath((char *)loop,(size_t *)(auStack_928 + 8));
  alStack_830[0] = (long)iVar1;
  uStack_918.data = (void *)0x0;
  if (alStack_830[0] == 0) {
    *(undefined1 *)((long)(auStack_928._8_8_ + 0x38) + (long)(uStack_630.reserved + -0xe)) = 0;
    pcStack_938 = (code *)0x1b3a54;
    memset(alStack_830,0x78,0x1ff);
    uStack_631 = 0;
    uStack_880.args = (char **)&puStack_8b0;
    pcStack_8a8 = "process_title_big_argv_helper";
    uStack_890 = 0;
    uStack_880.env = (char **)0x0;
    uStack_880.cwd = (char *)0x0;
    uStack_880.flags = 0;
    uStack_880.stdio_count = 0;
    uStack_880.stdio = (uv_stdio_container_t *)0x0;
    uStack_880.uid = 0;
    uStack_880.gid = 0;
    uStack_880.cpumask = (char *)0x0;
    uStack_880.cpumask_size = 0;
    uStack_880.exit_cb = exit_cb;
    pcStack_938 = (code *)0x1b3ab7;
    puStack_8b0 = loop;
    plStack_8a0 = alStack_830;
    plStack_898 = alStack_830;
    uStack_880.file = (char *)loop;
    puVar2 = uv_default_loop();
    pcStack_938 = (code *)0x1b3ac7;
    iVar1 = uv_spawn(puVar2,&uStack_918,&uStack_880);
    auStack_928._0_8_ = SEXT48(iVar1);
    pvStack_930 = (void *)0x0;
    if ((void *)auStack_928._0_8_ != (void *)0x0) goto LAB_001b3b7a;
    pcStack_938 = (code *)0x1b3ae6;
    puVar2 = uv_default_loop();
    pcStack_938 = (code *)0x1b3af0;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_928._0_8_ = SEXT48(iVar1);
    pvStack_930 = (void *)0x0;
    if ((void *)auStack_928._0_8_ == (void *)0x0) {
      pcStack_938 = (code *)0x1b3b0f;
      loop = uv_default_loop();
      pcStack_938 = (code *)0x1b3b23;
      uv_walk(loop,close_walk_cb,(void *)0x0);
      pcStack_938 = (code *)0x1b3b2d;
      uv_run(loop,UV_RUN_DEFAULT);
      auStack_928._0_8_ = (void *)0x0;
      pcStack_938 = (code *)0x1b3b3b;
      puVar2 = uv_default_loop();
      pcStack_938 = (code *)0x1b3b43;
      iVar1 = uv_loop_close(puVar2);
      pvStack_930 = (void *)(long)iVar1;
      if ((void *)auStack_928._0_8_ == pvStack_930) {
        pcStack_938 = (code *)0x1b3b59;
        uv_library_shutdown();
        return;
      }
      goto LAB_001b3b94;
    }
  }
  else {
    pcStack_938 = (code *)0x1b3b7a;
    run_test_process_title_big_argv_cold_1();
LAB_001b3b7a:
    pcStack_938 = (code *)0x1b3b87;
    run_test_process_title_big_argv_cold_2();
  }
  pcStack_938 = (code *)0x1b3b94;
  run_test_process_title_big_argv_cold_3();
LAB_001b3b94:
  puVar4 = (uv_handle_t *)auStack_928;
  pcStack_938 = exit_cb;
  run_test_process_title_big_argv_cold_4();
  uStack_940 = 0;
  if (ppvVar3 == (void **)0x0) {
    pcStack_938 = (code *)(long)extraout_EDX;
    uStack_940 = 0;
    if (pcStack_938 == (code *)0x0) {
      uv_close(puVar4,(uv_close_cb)0x0);
      return;
    }
  }
  else {
    puStack_950 = (uv_loop_t *)0x1b3bf6;
    pcStack_938 = (code *)ppvVar3;
    exit_cb_cold_1();
  }
  puStack_950 = (uv_loop_t *)process_title_big_argv;
  exit_cb_cold_2();
  buffer_00 = &auStack_a58[0].loop;
  puStack_950 = loop;
  memset(buffer_00,0,0x100);
  auStack_a58[0].loop._0_4_ = 0x6c696166;
  uv_get_process_title((char *)buffer_00,0x100);
  auStack_a58[0].data = (void *)0x0;
  iVar1 = strcmp((char *)buffer_00,"fail");
  if (auStack_a58[0].data != (void *)(long)iVar1) {
    return;
  }
  puVar4 = auStack_a58;
  process_title_big_argv_cold_1();
  iVar1 = uv_is_closing(puVar4);
  if (iVar1 != 0) {
    return;
  }
  uv_close(puVar4,(uv_close_cb)0x0);
  return;
}

Assistant:

static void set_title(const char* title) {
  char buffer[512];
  int err;

  err = uv_get_process_title(buffer, sizeof(buffer));
  ASSERT_OK(err);

  err = uv_set_process_title(title);
  ASSERT_OK(err);

  err = uv_get_process_title(buffer, sizeof(buffer));
  ASSERT_OK(err);

  ASSERT_OK(strcmp(buffer, title));
}